

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O3

ImportDefinition * __thiscall
flatbuffers::ts::TsGenerator::AddImport<flatbuffers::StructDef>
          (ImportDefinition *__return_storage_ptr__,TsGenerator *this,import_set *imports,
          Definition *dependent,StructDef *dependency)

{
  IdlNamer *this_00;
  Namespace *pNVar1;
  pointer pbVar2;
  pointer pbVar3;
  StructDef *pSVar4;
  ImportDefinition *pIVar5;
  TsGenerator *this_01;
  Definition *pDVar6;
  map<std::__cxx11::string,flatbuffers::(anonymous_namespace)::ImportDefinition,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::(anonymous_namespace)::ImportDefinition>>>
  *this_02;
  bool force_ns_wrap;
  iterator iVar7;
  undefined8 *puVar8;
  long *plVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  ulong *puVar12;
  long *plVar13;
  size_type *psVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  ulong uVar16;
  char *pcVar17;
  char *__end;
  _Alloc_hider _Var18;
  string import_extension;
  string rel_file_path;
  string bare_file_path;
  string name;
  string unique_name;
  string import_name;
  string symbols_expression;
  string object_name;
  ulong *local_2f0;
  long local_2e8;
  ulong local_2e0;
  long lStack_2d8;
  ulong *local_2d0;
  long local_2c8;
  ulong local_2c0;
  undefined4 uStack_2b8;
  undefined4 uStack_2b4;
  string local_2b0;
  long *local_290;
  long local_288;
  long local_280;
  long lStack_278;
  StructDef *local_270;
  undefined1 *local_268;
  undefined8 local_260;
  undefined1 local_258;
  undefined7 uStack_257;
  undefined1 *local_248;
  undefined8 local_240;
  undefined1 local_238;
  undefined7 uStack_237;
  ImportDefinition *local_228;
  Namer *local_220;
  TsGenerator *local_218;
  Definition *local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string local_1e8;
  long *local_1c8 [2];
  long local_1b8 [2];
  string local_1a8;
  map<std::__cxx11::string,flatbuffers::(anonymous_namespace)::ImportDefinition,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::(anonymous_namespace)::ImportDefinition>>>
  *local_188;
  string local_180;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>
  local_160;
  string local_70;
  string local_50;
  
  this_00 = &this->namer_;
  local_210 = dependent;
  IdlNamer::NamespacedType_abi_cxx11_(&local_1a8,this_00,&dependency->super_Definition);
  iVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>_>
          ::find(imports,&local_1a8);
  if ((_Rb_tree_header *)iVar7._M_node != &(imports->_M_t)._M_impl.super__Rb_tree_header) {
    anon_unknown_10::ImportDefinition::ImportDefinition
              (__return_storage_ptr__,(ImportDefinition *)(iVar7._M_node + 2));
    goto LAB_0023e17b;
  }
  local_270 = dependency;
  local_220 = &this_00->super_Namer;
  local_218 = this;
  (*(this_00->super_Namer)._vptr_Namer[0xf])(&local_180,this_00,dependency);
  _Var18._M_p = local_180._M_dataplus._M_p;
  force_ns_wrap =
       CheckIfNameClashes((TsGenerator *)imports,(import_set *)local_180._M_dataplus._M_p,
                          (string *)local_180._M_string_length);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  if (force_ns_wrap) {
    local_180._M_string_length = local_1a8._M_string_length;
    _Var18._M_p = local_1a8._M_dataplus._M_p;
  }
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,_Var18._M_p,
             (long)&(((ImportDefinition *)local_180._M_string_length)->name)._M_dataplus._M_p +
             (long)_Var18._M_p);
  this_01 = local_218;
  pSVar4 = local_270;
  GetTypeName_abi_cxx11_(&local_50,local_218,local_270,true,force_ns_wrap);
  local_228 = __return_storage_ptr__;
  local_188 = (map<std::__cxx11::string,flatbuffers::(anonymous_namespace)::ImportDefinition,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::(anonymous_namespace)::ImportDefinition>>>
               *)imports;
  GenSymbolExpression(&local_70,this_01,pSVar4,force_ns_wrap,&local_180,&local_1e8,&local_50);
  local_248 = &local_238;
  local_240 = 0;
  local_238 = 0;
  local_268 = &local_258;
  local_260 = 0;
  local_258 = 0;
  pNVar1 = local_210->defined_namespace;
  if ((pNVar1->components).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pNVar1->components).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
LAB_0023d80b:
    std::__cxx11::string::append((char *)&local_268);
  }
  else {
    paVar10 = &local_160.first.field_2;
    uVar16 = 0;
    do {
      if (uVar16 == 0) {
        local_160.first._M_dataplus._M_p = (pointer)paVar10;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"..","");
      }
      else {
        local_1c8[0] = local_1b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"..","");
        puVar8 = (undefined8 *)std::__cxx11::string::insert((ulong)local_1c8,0,'\x01');
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 == paVar11) {
          local_160.first.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_160.first.field_2._8_8_ = puVar8[3];
          local_160.first._M_dataplus._M_p = (pointer)paVar10;
        }
        else {
          local_160.first.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_160.first._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_160.first._M_string_length = puVar8[1];
        *puVar8 = paVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
      }
      std::__cxx11::string::_M_append((char *)&local_268,(ulong)local_160.first._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160.first._M_dataplus._M_p != paVar10) {
        operator_delete(local_160.first._M_dataplus._M_p,
                        local_160.first.field_2._M_allocated_capacity + 1);
      }
      if ((uVar16 != 0) && (local_1c8[0] != local_1b8)) {
        operator_delete(local_1c8[0],local_1b8[0] + 1);
      }
      uVar16 = uVar16 + 1;
      pbVar2 = (pNVar1->components).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (pNVar1->components).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar16 < (ulong)((long)pbVar3 - (long)pbVar2 >> 5));
    if (pbVar3 == pbVar2) goto LAB_0023d80b;
  }
  pSVar4 = local_270;
  Namer::Directories(&local_2b0,local_220,
                     &((local_270->super_Definition).defined_namespace)->components,OutputPath,
                     kUpperCamel);
  plVar9 = (long *)std::__cxx11::string::insert((ulong)&local_2b0,0,'\x01');
  puVar12 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar12) {
    local_2c0 = *puVar12;
    uStack_2b8 = (undefined4)plVar9[3];
    uStack_2b4 = *(undefined4 *)((long)plVar9 + 0x1c);
    local_2d0 = &local_2c0;
  }
  else {
    local_2c0 = *puVar12;
    local_2d0 = (ulong *)*plVar9;
  }
  local_2c8 = plVar9[1];
  *plVar9 = (long)puVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  (*local_220->_vptr_Namer[0xc])(&local_2f0,local_220,pSVar4,3);
  uVar16 = 0xf;
  if (local_2d0 != &local_2c0) {
    uVar16 = local_2c0;
  }
  if (uVar16 < (ulong)(local_2e8 + local_2c8)) {
    uVar16 = 0xf;
    if (local_2f0 != &local_2e0) {
      uVar16 = local_2e0;
    }
    if (uVar16 < (ulong)(local_2e8 + local_2c8)) goto LAB_0023d907;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2f0,0,(char *)0x0,(ulong)local_2d0);
  }
  else {
LAB_0023d907:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_2f0);
  }
  local_160.first._M_dataplus._M_p = (pointer)&local_160.first.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 == paVar10) {
    local_160.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_160.first.field_2._8_8_ = puVar8[3];
  }
  else {
    local_160.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_160.first._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_160.first._M_string_length = puVar8[1];
  *puVar8 = paVar10;
  puVar8[1] = 0;
  paVar10->_M_local_buf[0] = '\0';
  std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_160.first._M_dataplus._M_p);
  paVar10 = &local_160.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.first._M_dataplus._M_p != paVar10) {
    operator_delete(local_160.first._M_dataplus._M_p,
                    local_160.first.field_2._M_allocated_capacity + 1);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0,local_2e0 + 1);
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0,local_2c0 + 1);
  }
  paVar11 = &local_2b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar11) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_append((char *)&local_268,(ulong)local_248);
  pIVar5 = local_228;
  (local_228->name)._M_dataplus._M_p = (pointer)&(local_228->name).field_2;
  (local_228->name)._M_string_length = 0;
  (local_228->name).field_2._M_local_buf[0] = '\0';
  (local_228->import_statement)._M_dataplus._M_p = (pointer)&(local_228->import_statement).field_2;
  (local_228->import_statement)._M_string_length = 0;
  (local_228->import_statement).field_2._M_local_buf[0] = '\0';
  (local_228->export_statement)._M_dataplus._M_p = (pointer)&(local_228->export_statement).field_2;
  (local_228->export_statement)._M_string_length = 0;
  (local_228->export_statement).field_2._M_local_buf[0] = '\0';
  (local_228->bare_file_path)._M_dataplus._M_p = (pointer)&(local_228->bare_file_path).field_2;
  (local_228->bare_file_path)._M_string_length = 0;
  (local_228->bare_file_path).field_2._M_local_buf[0] = '\0';
  (local_228->rel_file_path)._M_dataplus._M_p = (pointer)&(local_228->rel_file_path).field_2;
  (local_228->rel_file_path)._M_string_length = 0;
  (local_228->rel_file_path).field_2._M_local_buf[0] = '\0';
  (local_228->object_name)._M_dataplus._M_p = (pointer)&(local_228->object_name).field_2;
  (local_228->object_name)._M_string_length = 0;
  (local_228->object_name).field_2._M_local_buf[0] = '\0';
  local_228->dependent = (Definition *)0x0;
  local_228->dependency = (Definition *)0x0;
  std::__cxx11::string::_M_assign((string *)local_228);
  std::__cxx11::string::_M_assign((string *)&pIVar5->object_name);
  std::__cxx11::string::_M_assign((string *)&pIVar5->bare_file_path);
  std::__cxx11::string::_M_assign((string *)&pIVar5->rel_file_path);
  uVar16 = (ulong)(((local_218->super_BaseGenerator).parser_)->opts).ts_no_import_ext;
  pcVar17 = ".js";
  if (uVar16 != 0) {
    pcVar17 = "";
  }
  local_2d0 = &local_2c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2d0,pcVar17,pcVar17 + (uVar16 ^ 1) * 3);
  std::operator+(&local_208,"import { ",&local_70);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_208);
  plVar13 = plVar9 + 2;
  if ((long *)*plVar9 == plVar13) {
    local_280 = *plVar13;
    lStack_278 = plVar9[3];
    local_290 = &local_280;
  }
  else {
    local_280 = *plVar13;
    local_290 = (long *)*plVar9;
  }
  local_288 = plVar9[1];
  *plVar9 = (long)plVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_268);
  puVar12 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar12) {
    local_2e0 = *puVar12;
    lStack_2d8 = plVar9[3];
    local_2f0 = &local_2e0;
  }
  else {
    local_2e0 = *puVar12;
    local_2f0 = (ulong *)*plVar9;
  }
  local_2e8 = plVar9[1];
  *plVar9 = (long)puVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_2d0);
  psVar14 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar14) {
    local_2b0.field_2._M_allocated_capacity = *psVar14;
    local_2b0.field_2._8_8_ = plVar9[3];
    local_2b0._M_dataplus._M_p = (pointer)paVar11;
  }
  else {
    local_2b0.field_2._M_allocated_capacity = *psVar14;
    local_2b0._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_2b0._M_string_length = plVar9[1];
  *plVar9 = (long)psVar14;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b0);
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 == paVar15) {
    local_160.first.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_160.first.field_2._8_8_ = puVar8[3];
    local_160.first._M_dataplus._M_p = (pointer)paVar10;
  }
  else {
    local_160.first.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_160.first._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_160.first._M_string_length = puVar8[1];
  *puVar8 = paVar15;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  std::__cxx11::string::operator=((string *)&pIVar5->import_statement,(string *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.first._M_dataplus._M_p != paVar10) {
    operator_delete(local_160.first._M_dataplus._M_p,
                    local_160.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar11) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0,local_2e0 + 1);
  }
  if (local_290 != &local_280) {
    operator_delete(local_290,local_280 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_208,"export { ",&local_70);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_208);
  local_290 = &local_280;
  plVar13 = plVar9 + 2;
  if ((long *)*plVar9 == plVar13) {
    local_280 = *plVar13;
    lStack_278 = plVar9[3];
  }
  else {
    local_280 = *plVar13;
    local_290 = (long *)*plVar9;
  }
  local_288 = plVar9[1];
  *plVar9 = (long)plVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_248);
  puVar12 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar12) {
    local_2e0 = *puVar12;
    lStack_2d8 = plVar9[3];
    local_2f0 = &local_2e0;
  }
  else {
    local_2e0 = *puVar12;
    local_2f0 = (ulong *)*plVar9;
  }
  local_2e8 = plVar9[1];
  *plVar9 = (long)puVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_2d0);
  psVar14 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar14) {
    local_2b0.field_2._M_allocated_capacity = *psVar14;
    local_2b0.field_2._8_8_ = plVar9[3];
    local_2b0._M_dataplus._M_p = (pointer)paVar11;
  }
  else {
    local_2b0.field_2._M_allocated_capacity = *psVar14;
    local_2b0._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_2b0._M_string_length = plVar9[1];
  *plVar9 = (long)psVar14;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b0);
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 == paVar15) {
    local_160.first.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_160.first.field_2._8_8_ = puVar8[3];
    local_160.first._M_dataplus._M_p = (pointer)paVar10;
  }
  else {
    local_160.first.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_160.first._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_160.first._M_string_length = puVar8[1];
  *puVar8 = paVar15;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  std::__cxx11::string::operator=((string *)&pIVar5->export_statement,(string *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.first._M_dataplus._M_p != paVar10) {
    operator_delete(local_160.first._M_dataplus._M_p,
                    local_160.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar11) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  pDVar6 = local_210;
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0,local_2e0 + 1);
  }
  this_02 = local_188;
  if (local_290 != &local_280) {
    operator_delete(local_290,local_280 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  pIVar5->dependency = &local_270->super_Definition;
  pIVar5->dependent = pDVar6;
  std::make_pair<std::__cxx11::string_const&,flatbuffers::(anonymous_namespace)::ImportDefinition&>
            (&local_160,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_1a8._M_dataplus._M_p,(ImportDefinition *)local_1a8._M_string_length);
  std::
  map<std::__cxx11::string,flatbuffers::(anonymous_namespace)::ImportDefinition,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::(anonymous_namespace)::ImportDefinition>>>
  ::insert<std::pair<std::__cxx11::string,flatbuffers::(anonymous_namespace)::ImportDefinition>>
            (this_02,&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.second.object_name._M_dataplus._M_p != &local_160.second.object_name.field_2) {
    operator_delete(local_160.second.object_name._M_dataplus._M_p,
                    local_160.second.object_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.second.rel_file_path._M_dataplus._M_p != &local_160.second.rel_file_path.field_2)
  {
    operator_delete(local_160.second.rel_file_path._M_dataplus._M_p,
                    local_160.second.rel_file_path.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.second.bare_file_path._M_dataplus._M_p !=
      &local_160.second.bare_file_path.field_2) {
    operator_delete(local_160.second.bare_file_path._M_dataplus._M_p,
                    local_160.second.bare_file_path.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.second.export_statement._M_dataplus._M_p !=
      &local_160.second.export_statement.field_2) {
    operator_delete(local_160.second.export_statement._M_dataplus._M_p,
                    local_160.second.export_statement.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.second.import_statement._M_dataplus._M_p !=
      &local_160.second.import_statement.field_2) {
    operator_delete(local_160.second.import_statement._M_dataplus._M_p,
                    local_160.second.import_statement.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.second.name._M_dataplus._M_p != &local_160.second.name.field_2) {
    operator_delete(local_160.second.name._M_dataplus._M_p,
                    local_160.second.name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.first._M_dataplus._M_p != paVar10) {
    operator_delete(local_160.first._M_dataplus._M_p,
                    local_160.first.field_2._M_allocated_capacity + 1);
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0,local_2c0 + 1);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268,CONCAT71(uStack_257,local_258) + 1);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248,CONCAT71(uStack_237,local_238) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
LAB_0023e17b:
  paVar10 = &local_1a8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar10) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    paVar10 = extraout_RAX;
  }
  return (ImportDefinition *)paVar10;
}

Assistant:

ImportDefinition AddImport(import_set &imports, const Definition &dependent,
                             const DefinitionT &dependency) {
    // The unique name of the dependency, fully qualified in its namespace.
    const std::string unique_name = GetTypeName(
        dependency, /*object_api = */ false, /*force_ns_wrap=*/true);

    // Look if we have already added this import and return its name if found.
    const auto import_pair = imports.find(unique_name);
    if (import_pair != imports.end()) { return import_pair->second; }

    // Check if this name would have a name clash with another type. Just use
    // the "base" name (properly escaped) without any namespacing applied.
    const std::string import_name = GetTypeName(dependency);
    const bool has_name_clash = CheckIfNameClashes(imports, import_name);

    // If we have a name clash, use the unique name, otherwise use simple name.
    std::string name = has_name_clash ? unique_name : import_name;

    const std::string object_name =
        GetTypeName(dependency, /*object_api=*/true, has_name_clash);

    const std::string symbols_expression = GenSymbolExpression(
        dependency, has_name_clash, import_name, name, object_name);

    std::string bare_file_path;
    std::string rel_file_path;
    const auto &dep_comps = dependent.defined_namespace->components;
    for (size_t i = 0; i < dep_comps.size(); i++) {
      rel_file_path += i == 0 ? ".." : (kPathSeparator + std::string(".."));
    }
    if (dep_comps.size() == 0) { rel_file_path += "."; }

    bare_file_path +=
        kPathSeparator +
        namer_.Directories(dependency.defined_namespace->components,
                           SkipDir::OutputPath) +
        namer_.File(dependency, SkipFile::SuffixAndExtension);
    rel_file_path += bare_file_path;

    ImportDefinition import;
    import.name = name;
    import.object_name = object_name;
    import.bare_file_path = bare_file_path;
    import.rel_file_path = rel_file_path;
    std::string import_extension = parser_.opts.ts_no_import_ext ? "" : ".js";
    import.import_statement = "import { " + symbols_expression + " } from '" +
                              rel_file_path + import_extension + "';";
    import.export_statement = "export { " + symbols_expression + " } from '." +
                              bare_file_path + import_extension + "';";
    import.dependency = &dependency;
    import.dependent = &dependent;

    imports.insert(std::make_pair(unique_name, import));

    return import;
  }